

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_version.c
# Opt level: O1

void test_version(void)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  wchar_t wVar4;
  ulong in_RAX;
  char *_v1;
  ulong uVar5;
  size_t sVar6;
  ushort **ppuVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  byte *pbVar13;
  long lVar14;
  byte *_v1_00;
  ulong local_38;
  
  local_38 = in_RAX;
  wVar4 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  failure("Unable to run %s --version",testprog);
  wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                           ,L'(',(uint)(wVar4 == L'\0'),"r == 0",(void *)0x0);
  if (wVar4 != L'\0') {
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
               ,L',',"version.stderr");
    _v1 = slurpfile(&local_38,"version.stdout");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                     ,L'0',(uint)(6 < local_38),"s > 6",(void *)0x0);
    failure("Version must start with \'bsdcat\': ``%s\'\'",_v1);
    wVar4 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                                ,L'2',_v1,"q","bsdcat ","\"bsdcat \"",7,"7",(void *)0x0);
    if (wVar4 != L'\0') {
      pcVar11 = _v1 + 7;
      uVar8 = local_38 - 7;
      pcVar12 = pcVar11;
      if (uVar8 != 0) {
        pcVar9 = _v1 + local_38;
        uVar3 = local_38 - 8;
        local_38 = uVar8;
        do {
          uVar5 = uVar3;
          pcVar12 = pcVar11;
          uVar8 = local_38;
          if (*pcVar11 != '.' && 9 < (byte)(*pcVar11 - 0x30U)) break;
          pcVar11 = pcVar11 + 1;
          uVar3 = uVar5 - 1;
          pcVar12 = pcVar9;
          local_38 = uVar5;
          uVar8 = uVar5;
        } while (uVar5 != 0);
      }
      local_38 = uVar8;
      failure("No space after bsdcat version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'<',(uint)(1 < local_38),"s > 1",(void *)0x0);
      uVar8 = (ulong)((byte)(*pcVar12 + 0x9fU) < 4);
      failure("No space after bsdcat version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'A',(uint)(pcVar12[uVar8] == ' '),"*q == \' \'",(void *)0x0);
      local_38 = local_38 - 1;
      failure("No `-\' between bsdcat and libarchive versions: ``%s\'\'",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                          ,L'E',pcVar12 + uVar8 + 1,"q","- ","\"- \"",2,"2",(void *)0x0);
      local_38 = local_38 - 2;
      failure("Not long enough for libarchive version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'I',(uint)(0xb < local_38),"s > 11",(void *)0x0);
      failure("Libarchive version must start with `libarchive\': ``%s\'\'",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                          ,L'K',pcVar12 + uVar8 + 3,"q","libarchive ","\"libarchive \"",0xb,"11",
                          (void *)0x0);
      pcVar9 = pcVar12 + uVar8 + 0xe;
      sVar10 = local_38 - 0xb;
      pcVar11 = pcVar9;
      if (sVar10 != 0) {
        lVar14 = uVar8 + local_38;
        sVar2 = local_38 - 0xc;
        local_38 = sVar10;
        do {
          sVar6 = sVar2;
          pcVar11 = pcVar9;
          sVar10 = local_38;
          if (*pcVar9 != '.' && 9 < (byte)(*pcVar9 - 0x30U)) break;
          pcVar9 = pcVar9 + 1;
          sVar2 = sVar6 - 1;
          pcVar11 = pcVar12 + lVar14 + 3;
          local_38 = sVar6;
          sVar10 = sVar6;
        } while (sVar6 != 0);
      }
      local_38 = sVar10;
      uVar8 = (ulong)((byte)(*pcVar11 + 0x9fU) < 4);
      _v1_00 = (byte *)(pcVar11 + uVar8);
      pbVar13 = _v1_00;
      if (local_38 != 0) {
        pbVar13 = (byte *)(pcVar11 + uVar8 + local_38);
        do {
          sVar10 = local_38 - 1;
          bVar1 = *_v1_00;
          if (((0x2f < (ulong)bVar1) || ((0xc00100000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
             (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(char)bVar1] & 8) == 0)) {
            wVar4 = L'\x01';
            goto LAB_00107f84;
          }
          _v1_00 = _v1_00 + 1;
          local_38 = sVar10;
        } while (sVar10 != 0);
      }
      wVar4 = L'\0';
      _v1_00 = pbVar13;
LAB_00107f84:
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'[',wVar4,"s >= 1",(void *)0x0);
      failure("Version output must end with \\n or \\r\\n");
      if (*_v1_00 == 0xd) {
        _v1_00 = _v1_00 + 1;
        local_38 = local_38 - 1;
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                          ,L'_',_v1_00,"q","\n","\"\\n\"",1,"1",(void *)0x0);
      free(_v1);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_version)
{
	int r;
	char *p, *q;
	size_t s;


	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	failure("Unable to run %s --version", testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stdout. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	q = p = slurpfile(&s, "version.stdout");
	/* Version message should start with name of program, then space. */
	assert(s > 6);
	failure("Version must start with 'bsdcat': ``%s''", p);
	if (!assertEqualMem(q, "bsdcat ", 7))
		return;
	q += 7; s -= 7;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Version number terminated by space. */
	failure("No space after bsdcat version: ``%s''", p);
	assert(s > 1);
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	failure("No space after bsdcat version: ``%s''", p);
	assert(*q == ' ');
	++q; --s;
	/* Separator. */
	failure("No `-' between bsdcat and libarchive versions: ``%s''", p);
	assertEqualMem(q, "- ", 2);
	q += 2; s -= 2;
	/* libarchive name and version number */
	failure("Not long enough for libarchive version: ``%s''", p);
	assert(s > 11);
	failure("Libarchive version must start with `libarchive': ``%s''", p);
	assertEqualMem(q, "libarchive ", 11);
	q += 11; s -= 11;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	/* Skip arbitrary third-party version numbers. */
	while (s > 0 && (*q == ' ' || *q == '/' || *q == '.' || isalnum(*q))) {
		++q;
		--s;
	}
	/* All terminated by end-of-line. */
	assert(s >= 1);
	/* Skip an optional CR character (e.g., Windows) */
	failure("Version output must end with \\n or \\r\\n");
	if (*q == '\r') { ++q; --s; }
	assertEqualMem(q, "\n", 1);
	free(p);
}